

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::StartSubexpression(ByteCodeWriter *this,ParseNode *node)

{
  SubexpressionNode local_28;
  
  if ((this->m_isInDebugMode == true) && (this->m_pMatchingNode != (ParseNode *)0x0)) {
    EnsureLongBranch(this,StatementBoundary);
    local_28.beginCodeSpan = (this->m_byteCodeData).currentOffset;
    local_28.node = node;
    JsUtil::
    List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(&this->m_subexpressionNodesStack->list,&local_28);
  }
  return;
}

Assistant:

void ByteCodeWriter::StartSubexpression(ParseNode* node)
    {
        if (!m_isInDebugMode || !m_pMatchingNode) // Subexpression not in debug mode or not enclosed in regular statement
        {
            return;
        }
#ifdef BYTECODE_BRANCH_ISLAND
        // If we are going to emit a branch island, it should be before the statement start
        this->EnsureLongBranch(Js::OpCode::StatementBoundary);
#endif
        m_subexpressionNodesStack->Push(SubexpressionNode(node, m_byteCodeData.GetCurrentOffset()));
    }